

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O3

el_action_t vi_next_word(EditLine *el,wint_t c)

{
  wchar_t *high;
  el_action_t eVar1;
  wchar_t *pwVar2;
  
  pwVar2 = (el->el_line).cursor;
  high = (el->el_line).lastchar;
  eVar1 = '\x06';
  if (pwVar2 < high + -1) {
    pwVar2 = cv_next_word(el,pwVar2,high,(el->el_state).argument,cv__isword);
    (el->el_line).cursor = pwVar2;
    eVar1 = '\x05';
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      eVar1 = '\x04';
    }
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_next_word(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor >= el->el_line.lastchar - 1)
		return CC_ERROR;

	el->el_line.cursor = cv_next_word(el, el->el_line.cursor,
	    el->el_line.lastchar, el->el_state.argument, cv__isword);

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}